

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

char * __thiscall xray_re::xr_ini_file::r_string(xr_ini_file *this,char *sname,char *lname)

{
  ini_item *piVar1;
  int iVar2;
  ini_section *piVar3;
  __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  _Var4;
  
  piVar3 = r_section(this,sname);
  _Var4 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_item*const*,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>,xray_re::xr_ini_file::ini_item_pred>
                    ((__normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
                      )(piVar3->items).
                       super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
                      )(piVar3->items).
                       super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(ini_item_pred)lname);
  if (_Var4._M_current !=
      (piVar3->items).
      super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    piVar1 = *_Var4._M_current;
    iVar2 = strcasecmp((piVar1->name)._M_dataplus._M_p,lname);
    if (iVar2 == 0) {
      return (piVar1->value)._M_dataplus._M_p;
    }
  }
  msg("can\'t find item %s in section %s",lname,sname);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                ,0x62,"const char *xray_re::xr_ini_file::r_string(const char *, const char *) const"
               );
}

Assistant:

const char* xr_ini_file::r_string(const char* sname, const char* lname) const
{
	const ini_section* section = r_section(sname);
	ini_item_vec_cit it = lower_bound_if(section->begin(), section->end(), ini_item_pred(lname));
	if (it == section->end() || xr_stricmp((*it)->name.c_str(), lname) != 0) {
		msg("can't find item %s in section %s", lname, sname);
		xr_not_expected();
	}
	return (*it)->value.c_str();
}